

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O3

int omac_acpkm_imit_ctrl(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  long *plVar2;
  EVP_MD *pEVar3;
  EVP_CIPHER *pEVar4;
  long lVar5;
  OMAC_ACPKM_CTX *c;
  code *pcVar6;
  void *key_size;
  gost_mac_key *key;
  int reason;
  char *name;
  size_t cipher_key_mesh;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (type < 0x1003) {
    if (type == 3) {
      lVar5 = EVP_MD_CTX_get0_md_data(ctx);
      iVar1 = OBJ_txt2nid(*(char **)(lVar5 + 0x10));
      if (iVar1 == 0x4a6) {
        if (arg - 9U < 0xfffffff8) {
          iVar1 = 0x1f5;
          goto LAB_00115332;
        }
      }
      else {
        if (iVar1 != 0x3f7) {
          return 0;
        }
        if (arg - 0x11U < 0xfffffff0) {
          iVar1 = 0x1ee;
LAB_00115332:
          ERR_GOST_error(0x90,0x75,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_omac_acpkm.c"
                         ,iVar1);
          return 0;
        }
      }
      *(ulong *)(lVar5 + 8) = (ulong)(uint)arg;
    }
    else {
      if (type != 0x20) {
        return 0;
      }
      plVar2 = (long *)EVP_MD_CTX_get0_md_data(ctx);
      if (arg == 0) {
        return -1;
      }
      pEVar3 = EVP_MD_CTX_md((EVP_MD_CTX *)ctx);
      iVar1 = EVP_MD_get_block_size(pEVar3);
      if (arg % iVar1 != 0) {
        return -1;
      }
      lVar5 = *plVar2;
      *(int *)(lVar5 + 0x84) = arg;
      if ((ptr != (void *)0x0) && (*ptr != 0)) {
        pEVar4 = EVP_CIPHER_CTX_cipher(*(EVP_CIPHER_CTX **)(lVar5 + 8));
        lVar5 = EVP_CIPHER_get0_provider(pEVar4);
        if (lVar5 == 0) {
          iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(*plVar2 + 8),0x20,*ptr,(void *)0x0);
        }
        else {
          local_38 = 0;
          uStack_30 = 0;
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          OSSL_PARAM_construct_size_t(&local_78,"key-mesh");
          iVar1 = EVP_CIPHER_CTX_set_params(*(undefined8 *)(*plVar2 + 8),&local_78);
        }
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    return 1;
  }
  if (type != 0x1004) {
    if (type == 0x1003) {
      *(undefined4 *)ptr = 0x20;
      return 1;
    }
    return 0;
  }
  key_size = ptr;
  c = (OMAC_ACPKM_CTX *)EVP_MD_CTX_get0_md_data(ctx);
  pEVar3 = EVP_MD_CTX_md((EVP_MD_CTX *)ctx);
  name = c->cipher_name;
  if (name == (char *)0x0) {
    iVar1 = EVP_MD_is_a(pEVar3,"kuznyechik-mac");
    if ((iVar1 == 0) && (iVar1 = EVP_MD_is_a(pEVar3,"kuznyechik-ctr-acpkm-omac"), iVar1 == 0)) {
      name = c->cipher_name;
    }
    else {
      name = "kuznyechik-cbc";
      c->cipher_name = "kuznyechik-cbc";
    }
  }
  pEVar4 = EVP_get_cipherbyname(name);
  if ((pEVar4 == (EVP_CIPHER *)0x0) &&
     (pEVar4 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,c->cipher_name,0), pEVar4 == (EVP_CIPHER *)0x0)) {
    key_size = (void *)0x1b8;
    ERR_GOST_error(0x90,0x67,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_omac_acpkm.c"
                   ,0x1b8);
    pEVar4 = (EVP_CIPHER *)0x0;
  }
  pEVar3 = EVP_MD_CTX_md((EVP_MD_CTX *)ctx);
  pcVar6 = (code *)EVP_MD_meth_get_init(pEVar3);
  iVar1 = (*pcVar6)(ctx);
  if (iVar1 < 1) {
    reason = 0x79;
    iVar1 = 0x1bb;
  }
  else {
    EVP_MD_CTX_set_flags((EVP_MD_CTX *)ctx,0x100);
    if (c->key_set == 0) {
      if (arg != 0x20) {
        if (arg != 0) {
          reason = 0x73;
          iVar1 = 0x1cb;
          goto LAB_00115301;
        }
        ptr = (void *)((long)ptr + 4);
      }
      iVar1 = omac_acpkm_key(c,(EVP_CIPHER *)pEVar4,(uchar *)ptr,(size_t)key_size);
      goto LAB_00115309;
    }
    reason = 0x84;
    iVar1 = 0x1c0;
  }
LAB_00115301:
  ERR_GOST_error(0x90,reason,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_omac_acpkm.c"
                 ,iVar1);
  iVar1 = 0;
LAB_00115309:
  EVP_CIPHER_free(pEVar4);
  return iVar1;
}

Assistant:

int omac_acpkm_imit_ctrl(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_KEY_LEN:
        *((unsigned int *)(ptr)) = 32;
        return 1;
    case EVP_MD_CTRL_SET_KEY:
        {
            OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
            const EVP_MD *md = EVP_MD_CTX_md(ctx);
            EVP_CIPHER *cipher = NULL;
            int ret = 0;

            if (c->cipher_name == NULL) {
                if (EVP_MD_is_a(md, SN_grasshopper_mac)
                    || EVP_MD_is_a(md, SN_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac))
                    c->cipher_name = SN_grasshopper_cbc;
            }
            if ((cipher =
                 (EVP_CIPHER *)EVP_get_cipherbyname(c->cipher_name)) == NULL
                && (cipher =
                    EVP_CIPHER_fetch(NULL, c->cipher_name, NULL)) == NULL) {
                GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_CIPHER_NOT_FOUND);
            }
            if (EVP_MD_meth_get_init(EVP_MD_CTX_md(ctx)) (ctx) <= 0) {
                GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_MAC_KEY_NOT_SET);
                goto set_key_end;
            }
            EVP_MD_CTX_set_flags(ctx, EVP_MD_CTX_FLAG_NO_INIT);
            if (c->key_set) {
                GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_BAD_ORDER);
                goto set_key_end;
            }
            if (arg == 0) {
                struct gost_mac_key *key = (struct gost_mac_key *)ptr;
                ret = omac_acpkm_key(c, cipher, key->key, 32);
                goto set_key_end;
            } else if (arg == 32) {
                ret = omac_acpkm_key(c, cipher, ptr, 32);
                goto set_key_end;
            }
            GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_INVALID_MAC_KEY_SIZE);
          set_key_end:
            EVP_CIPHER_free(cipher);
            return ret;
        }
    case EVP_CTRL_KEY_MESH:
        {
            OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
            if (!arg || (arg % EVP_MD_block_size(EVP_MD_CTX_md(ctx))))
                return -1;
            c->cmac_ctx->section_size = arg;
            if (ptr && *(int *)ptr) {
                /* Set parameter T */
                if (EVP_CIPHER_get0_provider(EVP_CIPHER_CTX_cipher(c->cmac_ctx->actx))
                    == NULL) {
                    if (!EVP_CIPHER_CTX_ctrl(c->cmac_ctx->actx, EVP_CTRL_KEY_MESH,
                                             *(int *)ptr, NULL))
                        return 0;
                } else {
                    size_t cipher_key_mesh = (size_t)*(int *)ptr;
                    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
                    params[0] = OSSL_PARAM_construct_size_t("key-mesh",
                                                            &cipher_key_mesh);
                    if (!EVP_CIPHER_CTX_set_params(c->cmac_ctx->actx, params))
                        return 0;
                }
            }
            return 1;
        }
    case EVP_MD_CTRL_XOF_LEN:   /* Supported in OpenSSL */
        {
            OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
            switch (OBJ_txt2nid(c->cipher_name)) {
            case NID_grasshopper_cbc:
                if (arg < 1 || arg > 16) {
                    GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            case NID_magma_cbc:
                if (arg < 1 || arg > 8) {
                    GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            default:
                return 0;
            }
            return 1;
        }

    default:
        return 0;
    }
}